

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O3

UINT32 TSS_GetTpmProperty(TSS_DEVICE *tpm,TPM_PT property)

{
  TPM_RC TVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  TPMI_YES_NO more;
  TPMS_CAPABILITY_DATA capData;
  TPMI_YES_NO local_411;
  TPMS_CAPABILITY_DATA local_410;
  
  local_411 = '\0';
  TVar1 = TPM2_GetCapability(tpm,6,property,1,&local_411,&local_410);
  if ((TVar1 == 0) && (local_410.capability == 6)) {
    if (local_410.data.algorithms.count == 1) {
      if (local_410.data.handles.handle[0] != property) {
        return 0xffffffff;
      }
      return local_410.data.handles.handle[1];
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0xffffffff;
    }
    pcVar4 = "Capability data count does not equal 1";
    iVar3 = 0x2ab;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0xffffffff;
    }
    pcVar4 = "Get Capability failure";
    iVar3 = 0x2a6;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
            ,"TSS_GetTpmProperty",iVar3,1,pcVar4);
  return 0xffffffff;
}

Assistant:

UINT32 TSS_GetTpmProperty(TSS_DEVICE* tpm, TPM_PT property)
{
    UINT32 result;
    TPMI_YES_NO                 more = NO;
    TPMS_CAPABILITY_DATA        capData;
    TPML_TAGGED_TPM_PROPERTY   *pProps = NULL;

    TPM_RC TSS_LastResponseCode = TPM2_GetCapability(tpm, TPM_CAP_TPM_PROPERTIES, property, 1, &more, &capData);
    if (TSS_LastResponseCode != TPM_RC_SUCCESS || capData.capability != TPM_CAP_TPM_PROPERTIES)
    {
        LogError("Get Capability failure");
        result = TSS_BAD_PROPERTY;
    }
    else if (capData.data.tpmProperties.count != 1)
    {
        LogError("Capability data count does not equal 1");
        result = TSS_BAD_PROPERTY;
    }
    else
    {
        pProps = &capData.data.tpmProperties;
        if (pProps->tpmProperty[0].property != property)
        {
            result = TSS_BAD_PROPERTY;
        }
        else
        {
            result = pProps->tpmProperty[0].value;
        }
    }
    return result;
}